

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t loader::zeImageGetDeviceOffsetExp(ze_image_handle_t hImage,uint64_t *pDeviceOffset)

{
  ze_pfnImageGetDeviceOffsetExp_t pfnGetDeviceOffsetExp;
  dditable_t *dditable;
  ze_result_t result;
  uint64_t *pDeviceOffset_local;
  ze_image_handle_t hImage_local;
  
  if (*(code **)(*(long *)(hImage + 8) + 0x3a8) == (code *)0x0) {
    hImage_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hImage_local._4_4_ =
         (**(code **)(*(long *)(hImage + 8) + 0x3a8))(*(undefined8 *)hImage,pDeviceOffset);
  }
  return hImage_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeImageGetDeviceOffsetExp(
        ze_image_handle_t hImage,                       ///< [in] handle of the image
        uint64_t* pDeviceOffset                         ///< [out] bindless device offset for image
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_image_object_t*>( hImage )->dditable;
        auto pfnGetDeviceOffsetExp = dditable->ze.ImageExp.pfnGetDeviceOffsetExp;
        if( nullptr == pfnGetDeviceOffsetExp )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hImage = reinterpret_cast<ze_image_object_t*>( hImage )->handle;

        // forward to device-driver
        result = pfnGetDeviceOffsetExp( hImage, pDeviceOffset );

        return result;
    }